

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

size_t Assimp::IFC::CloseWindows
                 (ContourVector *contours,IfcMatrix4 *minv,OpeningRefVector *contours_to_openings,
                 TempMesh *curmesh)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  double *pdVar3;
  pointer paVar4;
  pointer paVar5;
  pointer pvVar6;
  pointer ppTVar7;
  TempOpening *pTVar8;
  ulong *puVar9;
  uint *puVar10;
  bool bVar11;
  double dVar12;
  long lVar13;
  pointer ppTVar14;
  pointer ppTVar15;
  iterator current;
  pointer paVar16;
  size_t a;
  ulong uVar17;
  const_iterator cit;
  pointer paVar18;
  IfcVector3 *pIVar19;
  IfcVector3 *__x;
  long lVar20;
  const_iterator cit_1;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  const_iterator cVar25;
  size_t local_170;
  IfcVector3 contourNormal;
  IfcVector3 world_point;
  IfcVector3 start0;
  IfcVector3 start1;
  _Bit_const_iterator local_b0;
  OpeningRefVector *local_a0;
  ProjectedWindowContour *local_98;
  IfcVector3 *local_90;
  IfcVector3 *local_88;
  pointer local_80;
  IfcVector3 *local_78;
  OpeningRefs *__range3;
  aiVector3t<double> local_68;
  ContourRefVector adjacent_contours;
  
  current._M_current =
       (contours->
       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (contours->
             super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_170 = 0;
  local_a0 = contours_to_openings;
LAB_004df741:
  if (current._M_current == local_98) {
    return local_170;
  }
  paVar4 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar5 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar4 != paVar5) {
    lVar13 = ((long)current._M_current -
             (long)(contours->
                   super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x68;
    pvVar6 = (local_a0->
             super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __range3 = pvVar6 + lVar13;
    ppTVar15 = pvVar6[lVar13].
               super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar7 = *(pointer *)
               ((long)&pvVar6[lVar13].
                       super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    ppTVar14 = ppTVar15;
    do {
      if (ppTVar14 == ppTVar7) goto LAB_004df945;
      pTVar8 = *ppTVar14;
      ppTVar14 = ppTVar14 + 1;
    } while ((pTVar8->wallPoints).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start ==
             *(pointer *)
              ((long)&(pTVar8->wallPoints).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl + 8));
    adjacent_contours.
    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    adjacent_contours.
    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    adjacent_contours.
    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ProjectedWindowContour::PrepareSkiplist(current._M_current);
    FindAdjacentContours(current,contours);
    FindBorderContours(current);
    if ((current._M_current)->is_rectangular == true) {
      FindLikelyCrossingLines(current);
    }
    puVar9 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar13 = (long)((current._M_current)->contour).
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)((current._M_current)->contour).
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)puVar9) * 8
        != lVar13 >> 4) {
      __assert_fail("(*it).skiplist.size() == (*it).contour.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x386,
                    "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                   );
    }
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&curmesh->mVerts,
               (lVar13 >> 2) +
               ((long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(curmesh->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&curmesh->mVertcnt,
               ((long)((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) +
               ((long)(curmesh->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(curmesh->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2));
    puVar10 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar10) {
      bVar11 = false;
    }
    else {
      TempMesh::ComputePolygonNormal
                (&start0,(curmesh->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(ulong)*puVar10,true);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&start1,
                 (long)((current._M_current)->contour).
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)((current._M_current)->contour).
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4,
                 (allocator_type *)&contourNormal);
      lVar20 = 0;
      lVar13 = 0;
      for (uVar17 = 0;
          paVar4 = ((current._M_current)->contour).
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar17 < (ulong)((long)((current._M_current)->contour).
                                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 4);
          uVar17 = uVar17 + 1) {
        pdVar3 = (double *)((long)&paVar4->x + lVar20);
        world_point.x = *pdVar3;
        world_point.y = pdVar3[1];
        world_point.z = 0.0;
        ::operator*(minv,&world_point);
        *(double *)((long)start1.x + 0x10 + lVar13) = contourNormal.z;
        *(double *)((long)start1.x + lVar13) = contourNormal.x;
        ((double *)((long)start1.x + lVar13))[1] = contourNormal.y;
        lVar13 = lVar13 + 0x18;
        lVar20 = lVar20 + 0x10;
      }
      TempMesh::ComputePolygonNormal
                (&contourNormal,(IfcVector3 *)start1.x,((long)start1.y - (long)start1.x) / 0x18,true
                );
      bVar11 = 0.0 < contourNormal.z * start0.z +
                     contourNormal.x * start0.x + contourNormal.y * start0.y;
      std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                ((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&start1);
    }
    local_b0.super__Bit_iterator_base._M_offset = 0;
    start0.z = 0.0;
    start1.z = 0.0;
    start0.x = 0.0;
    start0.y = 0.0;
    start1.x = 0.0;
    start1.y = 0.0;
    paVar4 = ((current._M_current)->contour).
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar5 = ((current._M_current)->contour).
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __x = &world_point;
    if (bVar11) {
      __x = &contourNormal;
    }
    local_80 = paVar5 + -1;
    local_78 = &contourNormal;
    if (bVar11) {
      local_78 = &world_point;
    }
    local_90 = &start0;
    local_88 = &start1;
    if (bVar11) {
      local_90 = &start1;
      local_88 = &start0;
    }
    bVar21 = false;
    local_b0.super__Bit_iterator_base._M_p = puVar9;
    for (paVar18 = paVar4; paVar18 != paVar5; paVar18 = paVar18 + 1) {
      contourNormal.x = 0.0;
      contourNormal.y = 0.0;
      contourNormal.z = 0.0;
      local_68.x = paVar18->x;
      local_68.y = paVar18->y;
      local_68.z = 0.0;
      ::operator*(minv,&local_68);
      dVar12 = 10000000000.0;
      for (ppTVar15 = (__range3->
                      super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          ppTVar15 !=
          (__range3->
          super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
          )._M_impl.super__Vector_impl_data._M_finish; ppTVar15 = ppTVar15 + 1) {
        for (paVar16 = ((*ppTVar15)->wallPoints).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            paVar16 !=
            ((*ppTVar15)->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish; paVar16 = paVar16 + 1) {
          dVar23 = world_point.x - paVar16->x;
          dVar24 = world_point.y - paVar16->y;
          dVar22 = world_point.z - paVar16->z;
          dVar22 = dVar22 * dVar22 + dVar23 * dVar23 + dVar24 * dVar24;
          if ((dVar22 < dVar12) && (1e-05 <= dVar22)) {
            contourNormal.z = paVar16->z;
            contourNormal.x = paVar16->x;
            contourNormal.y = paVar16->y;
            dVar12 = dVar22;
          }
        }
      }
      if (bVar21) {
        ppaVar1 = &(curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + -2;
      }
      else {
        bVar21 = (bool)(paVar18 == paVar4 ^ bVar11);
        pIVar19 = &contourNormal;
        if (bVar21) {
          pIVar19 = &world_point;
        }
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&curmesh->mVerts,pIVar19);
        pIVar19 = &world_point;
        if (bVar21) {
          pIVar19 = &contourNormal;
        }
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&curmesh->mVerts,pIVar19);
        local_68.x = (double)CONCAT44(local_68.x._4_4_,4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&curmesh->mVertcnt,(uint *)&local_68);
        local_170 = local_170 + 1;
      }
      if (paVar18 == paVar4) {
        start0.z = world_point.z;
        start0.x = world_point.x;
        start0.y = world_point.y;
        start1.x = contourNormal.x;
        start1.y = contourNormal.y;
        start1.z = contourNormal.z;
      }
      else {
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&curmesh->mVerts,__x);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&curmesh->mVerts,local_78);
        if (paVar18 == local_80) {
          if ((*local_b0.super__Bit_iterator_base._M_p >>
               ((ulong)local_b0.super__Bit_iterator_base._M_offset & 0x3f) & 1) == 0) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,local_88);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,local_90);
          }
          else {
            ppuVar2 = &(curmesh->mVertcnt).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar2 = *ppuVar2 + -1;
            local_170 = local_170 - 1;
            ppaVar1 = &(curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + -2;
          }
        }
      }
      cVar25 = std::_Bit_const_iterator::operator++(&local_b0,0);
      bVar21 = (*cVar25.super__Bit_iterator_base._M_p >>
                (cVar25.super__Bit_iterator_base._8_8_ & 0x3f) & 1) != 0;
    }
    std::
    _Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
                     *)&adjacent_contours);
  }
  goto LAB_004dfd2a;
LAB_004df945:
  for (; ppTVar15 != ppTVar7; ppTVar15 = ppTVar15 + 1) {
    pTVar8 = *ppTVar15;
    paVar16 = (pTVar8->wallPoints).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (paVar16 !=
        *(pointer *)
         ((long)&(pTVar8->wallPoints).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl + 8)) {
      __assert_fail("opening->wallPoints.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x3ec,
                    "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                   );
    }
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&pTVar8->wallPoints,
               ((long)((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) +
               ((long)*(pointer *)
                       ((long)&(pTVar8->wallPoints).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl + 0x10) - (long)paVar16) / 0x18);
    for (paVar18 = paVar4; paVar18 != paVar5; paVar18 = paVar18 + 1) {
      start0.x = paVar18->x;
      start0.y = paVar18->y;
      start0.z = 0.0;
      ::operator*(minv,&start0);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                 &pTVar8->wallPoints,(aiVector3t<double> *)&adjacent_contours);
    }
  }
LAB_004dfd2a:
  current._M_current = current._M_current + 1;
  goto LAB_004df741;
}

Assistant:

size_t CloseWindows(ContourVector& contours,
    const IfcMatrix4& minv,
    OpeningRefVector& contours_to_openings,
    TempMesh& curmesh)
{
    size_t closed = 0;
    // For all contour points, check if one of the assigned openings does
    // already have points assigned to it. In this case, assume this is
    // the other side of the wall and generate connections between
    // the two holes in order to close the window.

    // All this gets complicated by the fact that contours may pertain to
    // multiple openings(due to merging of adjacent or overlapping openings).
    // The code is based on the assumption that this happens symmetrically
    // on both sides of the wall. If it doesn't (which would be a bug anyway)
    // wrong geometry may be generated.
    for (ContourVector::iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }
        OpeningRefs& refs = contours_to_openings[std::distance(contours.begin(), it)];

        bool has_other_side = false;
        for(const TempOpening* opening : refs) {
            if(!opening->wallPoints.empty()) {
                has_other_side = true;
                break;
            }
        }

        if (has_other_side) {

            ContourRefVector adjacent_contours;

            // prepare a skiplist for this contour. The skiplist is used to
            // eliminate unwanted contour lines for adjacent windows and
            // those bordering the outer frame.
            (*it).PrepareSkiplist();

            FindAdjacentContours(it, contours);
            FindBorderContours(it);

            // if the window is the result of a finite union or intersection of rectangles,
            // there shouldn't be any crossing or diagonal lines in it. Such lines would
            // be artifacts caused by numerical inaccuracies or other bugs in polyclipper
            // and our own code. Since rectangular openings are by far the most frequent
            // case, it is worth filtering for this corner case.
            if((*it).is_rectangular) {
                FindLikelyCrossingLines(it);
            }

            ai_assert((*it).skiplist.size() == (*it).contour.size());

            SkipList::const_iterator skipbegin = (*it).skiplist.begin();

            curmesh.mVerts.reserve(curmesh.mVerts.size() + (*it).contour.size() * 4);
            curmesh.mVertcnt.reserve(curmesh.mVertcnt.size() + (*it).contour.size());

			bool reverseCountourFaces = false;

            // compare base poly normal and contour normal to detect if we need to reverse the face winding
			if(curmesh.mVertcnt.size() > 0) {
				IfcVector3 basePolyNormal = TempMesh::ComputePolygonNormal(curmesh.mVerts.data(), curmesh.mVertcnt.front());
				
				std::vector<IfcVector3> worldSpaceContourVtx(it->contour.size());
				
				for(size_t a = 0; a < it->contour.size(); ++a)
					worldSpaceContourVtx[a] = minv * IfcVector3(it->contour[a].x, it->contour[a].y, 0.0);
				
				IfcVector3 contourNormal = TempMesh::ComputePolygonNormal(worldSpaceContourVtx.data(), worldSpaceContourVtx.size());
				
				reverseCountourFaces = (contourNormal * basePolyNormal) > 0.0;
			}

            // XXX this algorithm is really a bit inefficient - both in terms
            // of constant factor and of asymptotic runtime.
            std::vector<bool>::const_iterator skipit = skipbegin;

            IfcVector3 start0;
            IfcVector3 start1;

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();

            bool drop_this_edge = false;
            for (Contour::const_iterator cit = cbegin; cit != cend; ++cit, drop_this_edge = *skipit++) {
                const IfcVector2& proj_point = *cit;

                // Locate the closest opposite point. This should be a good heuristic to
                // connect only the points that are really intended to be connected.
                IfcFloat best = static_cast<IfcFloat>(1e10);
                IfcVector3 bestv;

                const IfcVector3 world_point = minv * IfcVector3(proj_point.x,proj_point.y,0.0f);

                for(const TempOpening* opening : refs) {
                    for(const IfcVector3& other : opening->wallPoints) {
                        const IfcFloat sqdist = (world_point - other).SquareLength();

                        if (sqdist < best) {
                            // avoid self-connections
                            if(sqdist < 1e-5) {
                                continue;
                            }

                            bestv = other;
                            best = sqdist;
                        }
                    }
                }

                if (drop_this_edge) {
                    curmesh.mVerts.pop_back();
                    curmesh.mVerts.pop_back();
                }
                else {
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? world_point : bestv);
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? bestv : world_point);

                    curmesh.mVertcnt.push_back(4);
                    ++closed;
                }

                if (cit == cbegin) {
                    start0 = world_point;
                    start1 = bestv;
                    continue;
                }

                curmesh.mVerts.push_back(reverseCountourFaces ? bestv : world_point);
                curmesh.mVerts.push_back(reverseCountourFaces ? world_point : bestv);

                if (cit == cend - 1) {
                    drop_this_edge = *skipit;

                    // Check if the final connection (last to first element) is itself
                    // a border edge that needs to be dropped.
                    if (drop_this_edge) {
                        --closed;
                        curmesh.mVertcnt.pop_back();
                        curmesh.mVerts.pop_back();
                        curmesh.mVerts.pop_back();
                    }
                    else {
                        curmesh.mVerts.push_back(reverseCountourFaces ? start0 : start1);
                        curmesh.mVerts.push_back(reverseCountourFaces ? start1 : start0);
                    }
                }
            }
        }
        else {

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();
            for(TempOpening* opening : refs) {
                ai_assert(opening->wallPoints.empty());
                opening->wallPoints.reserve(opening->wallPoints.capacity() + (*it).contour.size());
                for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {

                    const IfcVector2& proj_point = *cit;
                    opening->wallPoints.push_back(minv * IfcVector3(proj_point.x,proj_point.y,0.0f));
                }
            }
        }
    }
    return closed;
}